

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void initialize_node_type(void)

{
  mapped_type *pmVar1;
  allocator local_1f01;
  string local_1f00 [39];
  allocator local_1ed9;
  string local_1ed8 [39];
  allocator local_1eb1;
  string local_1eb0 [39];
  allocator local_1e89;
  string local_1e88 [39];
  allocator local_1e61;
  string local_1e60 [39];
  allocator local_1e39;
  string local_1e38 [39];
  allocator local_1e11;
  string local_1e10 [39];
  allocator local_1de9;
  string local_1de8 [39];
  allocator local_1dc1;
  string local_1dc0 [39];
  allocator local_1d99;
  string local_1d98 [39];
  allocator local_1d71;
  string local_1d70 [39];
  allocator local_1d49;
  string local_1d48 [39];
  allocator local_1d21;
  string local_1d20 [39];
  allocator local_1cf9;
  string local_1cf8 [39];
  allocator local_1cd1;
  string local_1cd0 [39];
  allocator local_1ca9;
  string local_1ca8 [39];
  allocator local_1c81;
  string local_1c80 [39];
  allocator local_1c59;
  string local_1c58 [39];
  allocator local_1c31;
  string local_1c30 [39];
  allocator local_1c09;
  string local_1c08 [39];
  allocator local_1be1;
  string local_1be0 [39];
  allocator local_1bb9;
  string local_1bb8 [39];
  allocator local_1b91;
  string local_1b90 [39];
  allocator local_1b69;
  string local_1b68 [39];
  allocator local_1b41;
  string local_1b40 [39];
  allocator local_1b19;
  string local_1b18 [39];
  allocator local_1af1;
  string local_1af0 [39];
  allocator local_1ac9;
  string local_1ac8 [39];
  allocator local_1aa1;
  string local_1aa0 [39];
  allocator local_1a79;
  string local_1a78 [39];
  allocator local_1a51;
  string local_1a50 [39];
  allocator local_1a29;
  string local_1a28 [39];
  allocator local_1a01;
  string local_1a00 [39];
  allocator local_19d9;
  string local_19d8 [39];
  allocator local_19b1;
  string local_19b0 [39];
  allocator local_1989;
  string local_1988 [39];
  allocator local_1961;
  string local_1960 [39];
  allocator local_1939;
  string local_1938 [39];
  allocator local_1911;
  string local_1910 [39];
  allocator local_18e9;
  string local_18e8 [39];
  allocator local_18c1;
  string local_18c0 [39];
  allocator local_1899;
  string local_1898 [39];
  allocator local_1871;
  string local_1870 [39];
  allocator local_1849;
  string local_1848 [39];
  allocator local_1821;
  string local_1820 [39];
  allocator local_17f9;
  string local_17f8 [39];
  allocator local_17d1;
  string local_17d0 [39];
  allocator local_17a9;
  string local_17a8 [39];
  allocator local_1781;
  string local_1780 [39];
  allocator local_1759;
  string local_1758 [39];
  allocator local_1731;
  string local_1730 [39];
  allocator local_1709;
  string local_1708 [39];
  allocator local_16e1;
  string local_16e0 [39];
  allocator local_16b9;
  string local_16b8 [39];
  allocator local_1691;
  string local_1690 [39];
  allocator local_1669;
  string local_1668 [39];
  allocator local_1641;
  string local_1640 [39];
  allocator local_1619;
  string local_1618 [39];
  allocator local_15f1;
  string local_15f0 [39];
  allocator local_15c9;
  string local_15c8 [39];
  allocator local_15a1;
  string local_15a0 [39];
  allocator local_1579;
  string local_1578 [39];
  allocator local_1551;
  string local_1550 [39];
  allocator local_1529;
  string local_1528 [39];
  allocator local_1501;
  string local_1500 [39];
  allocator local_14d9;
  string local_14d8 [39];
  allocator local_14b1;
  string local_14b0 [39];
  allocator local_1489;
  string local_1488 [39];
  allocator local_1461;
  string local_1460 [39];
  allocator local_1439;
  string local_1438 [39];
  allocator local_1411;
  string local_1410 [39];
  allocator local_13e9;
  string local_13e8 [39];
  allocator local_13c1;
  string local_13c0 [39];
  allocator local_1399;
  string local_1398 [39];
  allocator local_1371;
  string local_1370 [39];
  allocator local_1349;
  string local_1348 [39];
  allocator local_1321;
  string local_1320 [39];
  allocator local_12f9;
  string local_12f8 [39];
  allocator local_12d1;
  string local_12d0 [39];
  allocator local_12a9;
  string local_12a8 [39];
  allocator local_1281;
  string local_1280 [39];
  allocator local_1259;
  string local_1258 [39];
  allocator local_1231;
  string local_1230 [39];
  allocator local_1209;
  string local_1208 [39];
  allocator local_11e1;
  string local_11e0 [39];
  allocator local_11b9;
  string local_11b8 [39];
  allocator local_1191;
  string local_1190 [39];
  allocator local_1169;
  string local_1168 [39];
  allocator local_1141;
  string local_1140 [39];
  allocator local_1119;
  string local_1118 [39];
  allocator local_10f1;
  string local_10f0 [39];
  allocator local_10c9;
  string local_10c8 [39];
  allocator local_10a1;
  string local_10a0 [39];
  allocator local_1079;
  string local_1078 [39];
  allocator local_1051;
  string local_1050 [39];
  allocator local_1029;
  string local_1028 [39];
  allocator local_1001;
  string local_1000 [39];
  allocator local_fd9;
  string local_fd8 [39];
  allocator local_fb1;
  string local_fb0 [39];
  allocator local_f89;
  string local_f88 [39];
  allocator local_f61;
  string local_f60 [39];
  allocator local_f39;
  string local_f38 [39];
  allocator local_f11;
  string local_f10 [39];
  allocator local_ee9;
  string local_ee8 [39];
  allocator local_ec1;
  string local_ec0 [39];
  allocator local_e99;
  string local_e98 [39];
  allocator local_e71;
  string local_e70 [39];
  allocator local_e49;
  string local_e48 [39];
  allocator local_e21;
  string local_e20 [39];
  allocator local_df9;
  string local_df8 [39];
  allocator local_dd1;
  string local_dd0 [39];
  allocator local_da9;
  string local_da8 [39];
  allocator local_d81;
  string local_d80 [39];
  allocator local_d59;
  string local_d58 [39];
  allocator local_d31;
  string local_d30 [39];
  allocator local_d09;
  string local_d08 [39];
  allocator local_ce1;
  string local_ce0 [39];
  allocator local_cb9;
  string local_cb8 [39];
  allocator local_c91;
  string local_c90 [39];
  allocator local_c69;
  string local_c68 [39];
  allocator local_c41;
  string local_c40 [39];
  allocator local_c19;
  string local_c18 [39];
  allocator local_bf1;
  string local_bf0 [39];
  allocator local_bc9;
  string local_bc8 [39];
  allocator local_ba1;
  string local_ba0 [39];
  allocator local_b79;
  string local_b78 [39];
  allocator local_b51;
  string local_b50 [39];
  allocator local_b29;
  string local_b28 [39];
  allocator local_b01;
  string local_b00 [39];
  allocator local_ad9;
  string local_ad8 [39];
  allocator local_ab1;
  string local_ab0 [39];
  allocator local_a89;
  string local_a88 [39];
  allocator local_a61;
  string local_a60 [39];
  allocator local_a39;
  string local_a38 [39];
  allocator local_a11;
  string local_a10 [39];
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [39];
  allocator local_999;
  string local_998 [39];
  allocator local_971;
  string local_970 [39];
  allocator local_949;
  string local_948 [39];
  allocator local_921;
  string local_920 [39];
  allocator local_8f9;
  string local_8f8 [39];
  allocator local_8d1;
  string local_8d0 [39];
  allocator local_8a9;
  string local_8a8 [39];
  allocator local_881;
  string local_880 [39];
  allocator local_859;
  string local_858 [39];
  allocator local_831;
  string local_830 [39];
  allocator local_809;
  string local_808 [39];
  allocator local_7e1;
  string local_7e0 [39];
  allocator local_7b9;
  string local_7b8 [39];
  allocator local_791;
  string local_790 [39];
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [39];
  allocator local_6f1;
  string local_6f0 [39];
  allocator local_6c9;
  string local_6c8 [39];
  allocator local_6a1;
  string local_6a0 [39];
  allocator local_679;
  string local_678 [39];
  allocator local_651;
  string local_650 [39];
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [39];
  allocator local_589;
  string local_588 [39];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"access",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_28);
  *pmVar1 = 0x102;
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"allow",&local_61);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_60);
  *pmVar1 = 0x104;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"alternate",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_88);
  *pmVar1 = 0x105;
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"and",&local_b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_b0);
  *pmVar1 = 0x1ea;
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"any",&local_d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_d8);
  *pmVar1 = 0x106;
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"append",&local_101);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_100);
  *pmVar1 = 0x107;
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"as",&local_129);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_128);
  *pmVar1 = 0x108;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"ascending",&local_151);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_150);
  *pmVar1 = 0x109;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"back",&local_179);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_178);
  *pmVar1 = 0x10a;
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"bel",&local_1a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1a0);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"block",&local_1c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1c8);
  *pmVar1 = 0x10b;
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"blocksize",&local_1f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1f0);
  *pmVar1 = 0x10c;
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"bs",&local_219);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_218);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"bucketsize",&local_241);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_240);
  *pmVar1 = 0x10d;
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"buffer",&local_269);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_268);
  *pmVar1 = 0x10e;
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"by",&local_291);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_290);
  *pmVar1 = 0x10f;
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"byte",&local_2b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_2b8);
  *pmVar1 = 0x110;
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"call",&local_2e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_2e0);
  *pmVar1 = 0x111;
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"cause",&local_309);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_308);
  *pmVar1 = 0x113;
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"case",&local_331);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_330);
  *pmVar1 = 0x112;
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"chain",&local_359);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_358);
  *pmVar1 = 0x114;
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"change",&local_381);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_380);
  *pmVar1 = 0x115;
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"changes",&local_3a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_3a8);
  *pmVar1 = 0x118;
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"close",&local_3d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_3d0);
  *pmVar1 = 0x119;
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"clustersize",&local_3f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_3f8);
  *pmVar1 = 0x11a;
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"com",&local_421);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_420);
  *pmVar1 = 0x11b;
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"common",&local_449);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_448);
  *pmVar1 = 0x11b;
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"con",&local_471);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_470);
  *pmVar1 = 0x11c;
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"connect",&local_499);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_498);
  *pmVar1 = 0x120;
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"constant",&local_4c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_4c0);
  *pmVar1 = 0x11d;
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"contiguous",&local_4e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_4e8);
  *pmVar1 = 0x11e;
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"continue",&local_511);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_510);
  *pmVar1 = 0x11f;
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"count",&local_539);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_538);
  *pmVar1 = 0x121;
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"cr",&local_561);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_560);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"data",&local_589);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_588);
  *pmVar1 = 0x122;
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"decimal",&local_5b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_5b0);
  *pmVar1 = 0x123;
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"declare",&local_5d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_5d8);
  *pmVar1 = 0x124;
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"def",&local_601);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_600);
  *pmVar1 = 0x125;
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"defaultname",&local_629);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_628);
  *pmVar1 = 0x127;
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"del",&local_651);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_650);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_678,"delete",&local_679);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_678);
  *pmVar1 = 0x128;
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"desc",&local_6a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_6a0);
  *pmVar1 = 0x129;
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"descending",&local_6c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_6c8);
  *pmVar1 = 0x12a;
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"dim",&local_6f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_6f0);
  *pmVar1 = 299;
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"dimension",&local_719);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_718);
  *pmVar1 = 299;
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"double",&local_741);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_740);
  *pmVar1 = 300;
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"duplicates",&local_769);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_768);
  *pmVar1 = 0x12d;
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"else",&local_791);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_790);
  *pmVar1 = 0x12e;
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b8,"end",&local_7b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_7b8);
  *pmVar1 = 0x12f;
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e0,"eq",&local_7e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_7e0);
  *pmVar1 = 0x130;
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_808,"eqv",&local_809);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_808);
  *pmVar1 = 0x1e8;
  std::__cxx11::string::~string(local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"error",&local_831);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_830);
  *pmVar1 = 0x132;
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"esc",&local_859);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_858);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"exit",&local_881);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_880);
  *pmVar1 = 0x133;
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a8,"explicit",&local_8a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_8a8);
  *pmVar1 = 0x134;
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"extend",&local_8d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_8d0);
  *pmVar1 = 0x135;
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f8,"extendsize",&local_8f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_8f8);
  *pmVar1 = 0x136;
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"external",&local_921);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_920);
  *pmVar1 = 0x137;
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"explicit",&local_949);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_948);
  *pmVar1 = 0x134;
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_970,"ff",&local_971);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_970);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"field",&local_999);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_998);
  *pmVar1 = 0x138;
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"file",&local_9c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_9c0);
  *pmVar1 = 0x139;
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"filesize",&local_9e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_9e8);
  *pmVar1 = 0x13a;
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"find",&local_a11);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_a10);
  *pmVar1 = 0x13b;
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a38,"fixed",&local_a39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_a38);
  *pmVar1 = 0x13c;
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a60,"fnend",&local_a61);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_a60);
  *pmVar1 = 0x13d;
  std::__cxx11::string::~string(local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a88,"fnexit",&local_a89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_a88);
  *pmVar1 = 0x13e;
  std::__cxx11::string::~string(local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab0,"for",&local_ab1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_ab0);
  *pmVar1 = 0x13f;
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad8,"fortran",&local_ad9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_ad8);
  *pmVar1 = 0x140;
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b00,"free",&local_b01);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_b00);
  *pmVar1 = 0x141;
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"from",&local_b29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_b28);
  *pmVar1 = 0x142;
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b50,"function",&local_b51);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_b50);
  *pmVar1 = 0x143;
  std::__cxx11::string::~string(local_b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_b51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b78,"functionend",&local_b79);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_b78);
  *pmVar1 = 0x145;
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba0,"functionexit",&local_ba1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_ba0);
  *pmVar1 = 0x146;
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc8,"ge",&local_bc9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_bc8);
  *pmVar1 = 0x147;
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf0,"get",&local_bf1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_bf0);
  *pmVar1 = 0x148;
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c18,"gfloat",&local_c19);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_c18);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c40,"sfloat",&local_c41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_c40);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"tfloat",&local_c69);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_c68);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c90,"xfloat",&local_c91);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_c90);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb8,"dfloat",&local_cb9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_cb8);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce0,"go",&local_ce1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_ce0);
  *pmVar1 = 0x14a;
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"gosub",&local_d09);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_d08);
  *pmVar1 = 0x14b;
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d30,"goto",&local_d31);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_d30);
  *pmVar1 = 0x14c;
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d58,"gt",&local_d59);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_d58);
  *pmVar1 = 0x14d;
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d80,"handler",&local_d81);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_d80);
  *pmVar1 = 0x14e;
  std::__cxx11::string::~string(local_d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_da8,"hfloat",&local_da9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_da8);
  *pmVar1 = 0x14f;
  std::__cxx11::string::~string(local_da8);
  std::allocator<char>::~allocator((allocator<char> *)&local_da9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd0,"ht",&local_dd1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_dd0);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df8,"idn",&local_df9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_df8);
  *pmVar1 = 0x150;
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"if",&local_e21);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_e20);
  *pmVar1 = 0x151;
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e48,"imp",&local_e49);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_e48);
  *pmVar1 = 0x1ec;
  std::__cxx11::string::~string(local_e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_e49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e70,"in",&local_e71);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_e70);
  *pmVar1 = 0x152;
  std::__cxx11::string::~string(local_e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e98,"inv",&local_e99);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_e98);
  *pmVar1 = 0x154;
  std::__cxx11::string::~string(local_e98);
  std::allocator<char>::~allocator((allocator<char> *)&local_e99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ec0,"indexed",&local_ec1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_ec0);
  *pmVar1 = 0x155;
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee8,"input",&local_ee9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_ee8);
  *pmVar1 = 0x156;
  std::__cxx11::string::~string(local_ee8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f10,"integer",&local_f11);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_f10);
  *pmVar1 = 0x157;
  std::__cxx11::string::~string(local_f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"iterate",&local_f39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_f38);
  *pmVar1 = 0x158;
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f60,"key",&local_f61);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_f60);
  *pmVar1 = 0x159;
  std::__cxx11::string::~string(local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f88,"kill",&local_f89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_f88);
  *pmVar1 = 0x15a;
  std::__cxx11::string::~string(local_f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_f89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fb0,"let",&local_fb1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_fb0);
  *pmVar1 = 0x15b;
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fd8,"lf",&local_fd9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_fd8);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1000,"line",&local_1001);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1000);
  *pmVar1 = 0x15c;
  std::__cxx11::string::~string(local_1000);
  std::allocator<char>::~allocator((allocator<char> *)&local_1001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1028,"linput",&local_1029);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1028);
  *pmVar1 = 0x15d;
  std::__cxx11::string::~string(local_1028);
  std::allocator<char>::~allocator((allocator<char> *)&local_1029);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1050,"list",&local_1051);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1050);
  *pmVar1 = 0x15e;
  std::__cxx11::string::~string(local_1050);
  std::allocator<char>::~allocator((allocator<char> *)&local_1051);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1078,"long",&local_1079);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1078);
  *pmVar1 = 0x15f;
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10a0,"basic$quadword",&local_10a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_10a0);
  *pmVar1 = 0x15f;
  std::__cxx11::string::~string(local_10a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10c8,"quad",&local_10c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_10c8);
  *pmVar1 = 0x15f;
  std::__cxx11::string::~string(local_10c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10f0,"lset",&local_10f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_10f0);
  *pmVar1 = 0x160;
  std::__cxx11::string::~string(local_10f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1118,"map",&local_1119);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1118);
  *pmVar1 = 0x161;
  std::__cxx11::string::~string(local_1118);
  std::allocator<char>::~allocator((allocator<char> *)&local_1119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1140,"margin",&local_1141);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1140);
  *pmVar1 = 0x162;
  std::__cxx11::string::~string(local_1140);
  std::allocator<char>::~allocator((allocator<char> *)&local_1141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1168,"mat",&local_1169);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1168);
  *pmVar1 = 0x163;
  std::__cxx11::string::~string(local_1168);
  std::allocator<char>::~allocator((allocator<char> *)&local_1169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1190,"mod",&local_1191);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1190);
  *pmVar1 = 0x165;
  std::__cxx11::string::~string(local_1190);
  std::allocator<char>::~allocator((allocator<char> *)&local_1191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11b8,"mode",&local_11b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_11b8);
  *pmVar1 = 0x166;
  std::__cxx11::string::~string(local_11b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11e0,"modify",&local_11e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_11e0);
  *pmVar1 = 0x167;
  std::__cxx11::string::~string(local_11e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1208,"move",&local_1209);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1208);
  *pmVar1 = 0x168;
  std::__cxx11::string::~string(local_1208);
  std::allocator<char>::~allocator((allocator<char> *)&local_1209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1230,"name",&local_1231);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1230);
  *pmVar1 = 0x169;
  std::__cxx11::string::~string(local_1230);
  std::allocator<char>::~allocator((allocator<char> *)&local_1231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1258,"next",&local_1259);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1258);
  *pmVar1 = 0x16a;
  std::__cxx11::string::~string(local_1258);
  std::allocator<char>::~allocator((allocator<char> *)&local_1259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1280,"nochanges",&local_1281);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1280);
  *pmVar1 = 0x16c;
  std::__cxx11::string::~string(local_1280);
  std::allocator<char>::~allocator((allocator<char> *)&local_1281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12a8,"no",&local_12a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_12a8);
  *pmVar1 = 0x16b;
  std::__cxx11::string::~string(local_12a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12d0,"noduplicates",&local_12d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_12d0);
  *pmVar1 = 0x16d;
  std::__cxx11::string::~string(local_12d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12f8,"none",&local_12f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_12f8);
  *pmVar1 = 0x16f;
  std::__cxx11::string::~string(local_12f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1320,"nospan",&local_1321);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1320);
  *pmVar1 = 0x171;
  std::__cxx11::string::~string(local_1320);
  std::allocator<char>::~allocator((allocator<char> *)&local_1321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1348,"not",&local_1349);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1348);
  *pmVar1 = 0x1ee;
  std::__cxx11::string::~string(local_1348);
  std::allocator<char>::~allocator((allocator<char> *)&local_1349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1370,"nx",&local_1371);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1370);
  *pmVar1 = 0x14d;
  std::__cxx11::string::~string(local_1370);
  std::allocator<char>::~allocator((allocator<char> *)&local_1371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"nxeq",&local_1399);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1398);
  *pmVar1 = 0x147;
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13c0,"on",&local_13c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_13c0);
  *pmVar1 = 0x172;
  std::__cxx11::string::~string(local_13c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13e8,"onerror",&local_13e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_13e8);
  *pmVar1 = 0x1f9;
  std::__cxx11::string::~string(local_13e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1410,"open",&local_1411);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1410);
  *pmVar1 = 0x173;
  std::__cxx11::string::~string(local_1410);
  std::allocator<char>::~allocator((allocator<char> *)&local_1411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1438,"option",&local_1439);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1438);
  *pmVar1 = 0x174;
  std::__cxx11::string::~string(local_1438);
  std::allocator<char>::~allocator((allocator<char> *)&local_1439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1460,"or",&local_1461);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1460);
  *pmVar1 = 0x1eb;
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1488,"otherwise",&local_1489);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1488);
  *pmVar1 = 0x176;
  std::__cxx11::string::~string(local_1488);
  std::allocator<char>::~allocator((allocator<char> *)&local_1489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14b0,"output",&local_14b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_14b0);
  *pmVar1 = 0x177;
  std::__cxx11::string::~string(local_14b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14d8,"organization",&local_14d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_14d8);
  *pmVar1 = 0x175;
  std::__cxx11::string::~string(local_14d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1500,"pi",&local_1501);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1500);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_1500);
  std::allocator<char>::~allocator((allocator<char> *)&local_1501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1528,"primary",&local_1529);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1528);
  *pmVar1 = 0x179;
  std::__cxx11::string::~string(local_1528);
  std::allocator<char>::~allocator((allocator<char> *)&local_1529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1550,"print",&local_1551);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1550);
  *pmVar1 = 0x17a;
  std::__cxx11::string::~string(local_1550);
  std::allocator<char>::~allocator((allocator<char> *)&local_1551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1578,"program",&local_1579);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1578);
  *pmVar1 = 0x17c;
  std::__cxx11::string::~string(local_1578);
  std::allocator<char>::~allocator((allocator<char> *)&local_1579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15a0,"prompt",&local_15a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_15a0);
  *pmVar1 = 0x17b;
  std::__cxx11::string::~string(local_15a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15c8,"put",&local_15c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_15c8);
  *pmVar1 = 0x17f;
  std::__cxx11::string::~string(local_15c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15f0,"read",&local_15f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_15f0);
  *pmVar1 = 0x181;
  std::__cxx11::string::~string(local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1618,"real",&local_1619);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1618);
  *pmVar1 = 0x182;
  std::__cxx11::string::~string(local_1618);
  std::allocator<char>::~allocator((allocator<char> *)&local_1619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1640,"record",&local_1641);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1640);
  *pmVar1 = 0x183;
  std::__cxx11::string::~string(local_1640);
  std::allocator<char>::~allocator((allocator<char> *)&local_1641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1668,"recordtype",&local_1669);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1668);
  *pmVar1 = 0x184;
  std::__cxx11::string::~string(local_1668);
  std::allocator<char>::~allocator((allocator<char> *)&local_1669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1690,"recordsize",&local_1691);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1690);
  *pmVar1 = 0x185;
  std::__cxx11::string::~string(local_1690);
  std::allocator<char>::~allocator((allocator<char> *)&local_1691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16b8,"ref",&local_16b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_16b8);
  *pmVar1 = 0x186;
  std::__cxx11::string::~string(local_16b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16e0,"regardless",&local_16e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_16e0);
  *pmVar1 = 0x187;
  std::__cxx11::string::~string(local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1708,"relative",&local_1709);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1708);
  *pmVar1 = 0x188;
  std::__cxx11::string::~string(local_1708);
  std::allocator<char>::~allocator((allocator<char> *)&local_1709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1730,"reset",&local_1731);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1730);
  *pmVar1 = 0x18c;
  std::__cxx11::string::~string(local_1730);
  std::allocator<char>::~allocator((allocator<char> *)&local_1731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1758,"restore",&local_1759);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1758);
  *pmVar1 = 0x18b;
  std::__cxx11::string::~string(local_1758);
  std::allocator<char>::~allocator((allocator<char> *)&local_1759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1780,"resume",&local_1781);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1780);
  *pmVar1 = 0x18d;
  std::__cxx11::string::~string(local_1780);
  std::allocator<char>::~allocator((allocator<char> *)&local_1781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17a8,"return",&local_17a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_17a8);
  *pmVar1 = 399;
  std::__cxx11::string::~string(local_17a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17d0,"retry",&local_17d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_17d0);
  *pmVar1 = 0x18e;
  std::__cxx11::string::~string(local_17d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17f8,"rfa",&local_17f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_17f8);
  *pmVar1 = 0x191;
  std::__cxx11::string::~string(local_17f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1820,"rset",&local_1821);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1820);
  *pmVar1 = 0x193;
  std::__cxx11::string::~string(local_1820);
  std::allocator<char>::~allocator((allocator<char> *)&local_1821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1848,"scale",&local_1849);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1848);
  *pmVar1 = 0x194;
  std::__cxx11::string::~string(local_1848);
  std::allocator<char>::~allocator((allocator<char> *)&local_1849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1870,"scratch",&local_1871);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1870);
  *pmVar1 = 0x195;
  std::__cxx11::string::~string(local_1870);
  std::allocator<char>::~allocator((allocator<char> *)&local_1871);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1898,"select",&local_1899);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1898);
  *pmVar1 = 0x196;
  std::__cxx11::string::~string(local_1898);
  std::allocator<char>::~allocator((allocator<char> *)&local_1899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18c0,"sequential",&local_18c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_18c0);
  *pmVar1 = 0x197;
  std::__cxx11::string::~string(local_18c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18e8,"set",&local_18e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_18e8);
  *pmVar1 = 0x198;
  std::__cxx11::string::~string(local_18e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1910,"si",&local_1911);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1910);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_1910);
  std::allocator<char>::~allocator((allocator<char> *)&local_1911);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1938,"single",&local_1939);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1938);
  *pmVar1 = 0x199;
  std::__cxx11::string::~string(local_1938);
  std::allocator<char>::~allocator((allocator<char> *)&local_1939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1960,"size",&local_1961);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1960);
  *pmVar1 = 0x19a;
  std::__cxx11::string::~string(local_1960);
  std::allocator<char>::~allocator((allocator<char> *)&local_1961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1988,"sleep",&local_1989);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1988);
  *pmVar1 = 0x19b;
  std::__cxx11::string::~string(local_1988);
  std::allocator<char>::~allocator((allocator<char> *)&local_1989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19b0,"so",&local_19b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_19b0);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_19b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19d8,"sp",&local_19d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_19d8);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_19d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a00,"span",&local_1a01);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1a00);
  *pmVar1 = 0x19c;
  std::__cxx11::string::~string(local_1a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a28,"step",&local_1a29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1a28);
  *pmVar1 = 0x19d;
  std::__cxx11::string::~string(local_1a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a50,"stop",&local_1a51);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1a50);
  *pmVar1 = 0x19e;
  std::__cxx11::string::~string(local_1a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a78,"stream",&local_1a79);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1a78);
  *pmVar1 = 0x19f;
  std::__cxx11::string::~string(local_1a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1aa0,"string",&local_1aa1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1aa0);
  *pmVar1 = 0x1a0;
  std::__cxx11::string::~string(local_1aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ac8,"sub",&local_1ac9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1ac8);
  *pmVar1 = 0x1a1;
  std::__cxx11::string::~string(local_1ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1af0,"subend",&local_1af1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1af0);
  *pmVar1 = 0x1a2;
  std::__cxx11::string::~string(local_1af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b18,"subexit",&local_1b19);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1b18);
  *pmVar1 = 0x1a3;
  std::__cxx11::string::~string(local_1b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b40,"temporary",&local_1b41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1b40);
  *pmVar1 = 0x1a5;
  std::__cxx11::string::~string(local_1b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b68,"then",&local_1b69);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1b68);
  *pmVar1 = 0x1a6;
  std::__cxx11::string::~string(local_1b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b90,"to",&local_1b91);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1b90);
  *pmVar1 = 0x1a7;
  std::__cxx11::string::~string(local_1b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bb8,"trn",&local_1bb9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1bb8);
  *pmVar1 = 0x1a8;
  std::__cxx11::string::~string(local_1bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1be0,"type",&local_1be1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1be0);
  *pmVar1 = 0x1a9;
  std::__cxx11::string::~string(local_1be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c08,"undefined",&local_1c09);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1c08);
  *pmVar1 = 0x1aa;
  std::__cxx11::string::~string(local_1c08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c30,"unless",&local_1c31);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1c30);
  *pmVar1 = 0x1ab;
  std::__cxx11::string::~string(local_1c30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c58,"unlock",&local_1c59);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1c58);
  *pmVar1 = 0x1ac;
  std::__cxx11::string::~string(local_1c58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c80,"until",&local_1c81);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1c80);
  *pmVar1 = 0x1ad;
  std::__cxx11::string::~string(local_1c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ca8,"update",&local_1ca9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1ca8);
  *pmVar1 = 0x1ae;
  std::__cxx11::string::~string(local_1ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cd0,"use",&local_1cd1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1cd0);
  *pmVar1 = 0x1af;
  std::__cxx11::string::~string(local_1cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cf8,"using",&local_1cf9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1cf8);
  *pmVar1 = 0x1b1;
  std::__cxx11::string::~string(local_1cf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d20,"value",&local_1d21);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1d20);
  *pmVar1 = 0x1b2;
  std::__cxx11::string::~string(local_1d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d48,"variable",&local_1d49);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1d48);
  *pmVar1 = 0x1b3;
  std::__cxx11::string::~string(local_1d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d70,"variant",&local_1d71);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1d70);
  *pmVar1 = 0x1b4;
  std::__cxx11::string::~string(local_1d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d98,"virtual",&local_1d99);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1d98);
  *pmVar1 = 0x1b5;
  std::__cxx11::string::~string(local_1d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1dc0,"vt",&local_1dc1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1dc0);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string(local_1dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1de8,"wait",&local_1de9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1de8);
  *pmVar1 = 0x1b6;
  std::__cxx11::string::~string(local_1de8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1de9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e10,"when",&local_1e11);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1e10);
  *pmVar1 = 0x1b7;
  std::__cxx11::string::~string(local_1e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e38,"while",&local_1e39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1e38);
  *pmVar1 = 0x1b8;
  std::__cxx11::string::~string(local_1e38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e60,"windowsize",&local_1e61);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1e60);
  *pmVar1 = 0x1b9;
  std::__cxx11::string::~string(local_1e60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e88,"word",&local_1e89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1e88);
  *pmVar1 = 0x1ba;
  std::__cxx11::string::~string(local_1e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1eb0,"write",&local_1eb1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1eb0);
  *pmVar1 = 0x1bb;
  std::__cxx11::string::~string(local_1eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ed8,"xor",&local_1ed9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1ed8);
  *pmVar1 = 0x1ed;
  std::__cxx11::string::~string(local_1ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f00,"zer",&local_1f01);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,(key_type *)local_1f00);
  *pmVar1 = 0x1bc;
  std::__cxx11::string::~string(local_1f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f01);
  return;
}

Assistant:

static void initialize_node_type(void)
{
	node_type["access"] = BAS_S_ACCESS;
	node_type["allow"] = BAS_S_ALLOW;
	node_type["alternate"] = BAS_S_ALTERNATE;
	node_type["and"] = BAS_S_AND;
	node_type["any"] = BAS_S_ANY;
	node_type["append"] = BAS_S_APPEND;
	node_type["as"] = BAS_S_AS;
	node_type["ascending"] = BAS_S_ASCENDING;
	node_type["back"] = BAS_S_BACK;
	node_type["bel"] = BAS_V_PREDEF;
	node_type["block"] = BAS_S_BLOCK;
	node_type["blocksize"] = BAS_S_BLOCKSIZE;
	node_type["bs"] = BAS_V_PREDEF;
	node_type["bucketsize"] = BAS_S_BUCKETSIZE;
	node_type["buffer"] = BAS_S_BUFFER;
	node_type["by"] = BAS_S_BY;
	node_type["byte"] = BAS_S_BYTE;
	node_type["call"] = BAS_S_CALL;
	node_type["cause"] = BAS_S_CAUSE;
	node_type["case"] = BAS_S_CASE;
	node_type["chain"] = BAS_S_CHAIN;
	node_type["change"] = BAS_S_CHANGE;
	node_type["changes"] = BAS_S_CHANGES;
	node_type["close"] = BAS_S_CLOSE;
	node_type["clustersize"] = BAS_S_CLUSTERSIZE;
	node_type["com"] = BAS_S_COMMON;
	node_type["common"] = BAS_S_COMMON;
	node_type["con"] = BAS_S_CON;
	node_type["connect"] = BAS_S_CONNECT;
	node_type["constant"] = BAS_S_CONSTANT;
	node_type["contiguous"] = BAS_S_CONTIGUOUS;
	node_type["continue"] = BAS_S_CONTINUE;
	node_type["count"] = BAS_S_COUNT;
	node_type["cr"] = BAS_V_PREDEF;
	node_type["data"] = BAS_S_DATA;
	node_type["decimal"] = BAS_S_DECIMAL;
	node_type["declare"] = BAS_S_DECLARE;
	node_type["def"] = BAS_S_DEF;
	node_type["defaultname"] = BAS_S_DEFAULTNAME;
	node_type["del"] = BAS_V_PREDEF;
	node_type["delete"] = BAS_S_DELETE;
	node_type["desc"] = BAS_S_DESC;
	node_type["descending"] = BAS_S_DESCENDING;
	node_type["dim"] = BAS_S_DIM;
	node_type["dimension"] = BAS_S_DIM;
	node_type["double"] = BAS_S_DOUBLE;
	node_type["duplicates"] = BAS_S_DUPLICATES;
	node_type["else"] = BAS_S_ELSE;
	node_type["end"] = BAS_S_END;
	node_type["eq"] = BAS_S_EQ;
	node_type["eqv"] = BAS_S_EQV;
	node_type["error"] = BAS_S_ERROR;
	node_type["esc"] = BAS_V_PREDEF;
	node_type["exit"] = BAS_S_EXIT;
	node_type["explicit"] = BAS_S_EXPLICIT;
	node_type["extend"] = BAS_S_EXTEND;
	node_type["extendsize"] = BAS_S_EXTENDSIZE;
	node_type["external"] = BAS_S_EXTERNAL;
	node_type["explicit"] = BAS_S_EXPLICIT;
	node_type["ff"] = BAS_V_PREDEF;
	node_type["field"] = BAS_S_FIELD;
	node_type["file"] = BAS_S_FILE;
	node_type["filesize"] = BAS_S_FILESIZE;
	node_type["find"] = BAS_S_FIND;
	node_type["fixed"] = BAS_S_FIXED;
	node_type["fnend"] = BAS_S_FNEND;
	node_type["fnexit"] = BAS_S_FNEXIT;
	node_type["for"] = BAS_S_FOR;
	node_type["fortran"] = BAS_S_FORTRAN;
	node_type["free"] = BAS_S_FREE;
	node_type["from"] = BAS_S_FROM;
	node_type["function"] = BAS_S_FUNCTION;
	node_type["functionend"] = BAS_S_FUNCTIONEND;
	node_type["functionexit"] = BAS_S_FUNCTIONEXIT;
	node_type["ge"] = BAS_S_GE;
	node_type["get"] = BAS_S_GET;
	node_type["gfloat"] = BAS_S_GFLOAT;
	node_type["sfloat"] = BAS_S_GFLOAT;
	node_type["tfloat"] = BAS_S_GFLOAT;
	node_type["xfloat"] = BAS_S_GFLOAT;
	node_type["dfloat"] = BAS_S_GFLOAT;
	node_type["go"] = BAS_S_GO;
	node_type["gosub"] = BAS_S_GOSUB;
	node_type["goto"] = BAS_S_GOTO;
	node_type["gt"] = BAS_S_GT;
	node_type["handler"] = BAS_S_HANDLER;
	node_type["hfloat"] = BAS_S_HFLOAT;
	node_type["ht"] = BAS_V_PREDEF;
	node_type["idn"] = BAS_S_IDN;
	node_type["if"] = BAS_S_IF;
	node_type["imp"] = BAS_S_IMP;
	node_type["in"] = BAS_S_IN;
	node_type["inv"] = BAS_S_INV;
	node_type["indexed"] = BAS_S_INDEXED;
	node_type["input"] = BAS_S_INPUT;
	node_type["integer"] = BAS_S_INTEGER;
	node_type["iterate"] = BAS_S_ITERATE;
	node_type["key"] = BAS_S_KEY;
	node_type["kill"] = BAS_S_KILL;
	node_type["let"] = BAS_S_LET;
	node_type["lf"] = BAS_V_PREDEF;
	node_type["line"] = BAS_S_LINE;
	node_type["linput"] = BAS_S_LINPUT;
	node_type["list"] = BAS_S_LIST;
	node_type["long"] = BAS_S_LONG;
	node_type["basic$quadword"] = BAS_S_LONG;
	node_type["quad"] = BAS_S_LONG;
	node_type["lset"] = BAS_S_LSET;
	node_type["map"] = BAS_S_MAP;
	node_type["margin"] = BAS_S_MARGIN;
	node_type["mat"] = BAS_S_MAT;
	node_type["mod"] = BAS_S_MOD;
	node_type["mode"] = BAS_S_MODE;
	node_type["modify"] = BAS_S_MODIFY;
	node_type["move"] = BAS_S_MOVE;
	node_type["name"] = BAS_S_NAME;
	node_type["next"] = BAS_S_NEXT;
	node_type["nochanges"] = BAS_S_NOCHANGES;
	node_type["no"] = BAS_S_NO;
	node_type["noduplicates"] = BAS_S_NODUPLICATES;
	node_type["none"] = BAS_S_NONE;
	node_type["nospan"] = BAS_S_NOSPAN;
	node_type["not"] = BAS_S_NOT;
	node_type["nx"] = BAS_S_GT;
	node_type["nxeq"] = BAS_S_GE;
	node_type["on"] = BAS_S_ON;
	node_type["onerror"] = BAS_N_ONERROR;
	node_type["open"] = BAS_S_OPEN;
	node_type["option"] = BAS_S_OPTION;
	node_type["or"] = BAS_S_OR;
	node_type["otherwise"] = BAS_S_OTHERWISE;
	node_type["output"] = BAS_S_OUTPUT;
	node_type["organization"] = BAS_S_ORGANIZATION;
	node_type["pi"] = BAS_V_PREDEF;
	node_type["primary"] = BAS_S_PRIMARY;
	node_type["print"] = BAS_S_PRINT;
	node_type["program"] = BAS_S_PROGRAM;
	node_type["prompt"] = BAS_S_PROMPT;
	node_type["put"] = BAS_S_PUT;
	node_type["read"] = BAS_S_READ;
	node_type["real"] = BAS_S_REAL;
	node_type["record"] = BAS_S_RECORD;
	node_type["recordtype"] = BAS_S_RECORDTYPE;
	node_type["recordsize"] = BAS_S_RECORDSIZE;
	node_type["ref"] = BAS_S_REF;
	node_type["regardless"] = BAS_S_REGARDLESS;
	node_type["relative"] = BAS_S_RELATIVE;
	node_type["reset"] = BAS_S_RESET;
	node_type["restore"] = BAS_S_RESTORE;
	node_type["resume"] = BAS_S_RESUME;
	node_type["return"] = BAS_S_RETURN;
	node_type["retry"] = BAS_S_RETRY;
	node_type["rfa"] = BAS_S_RFA;
	node_type["rset"] = BAS_S_RSET;
	node_type["scale"] = BAS_S_SCALE;
	node_type["scratch"] = BAS_S_SCRATCH;
	node_type["select"] = BAS_S_SELECT;
	node_type["sequential"] = BAS_S_SEQUENTIAL;
	node_type["set"] = BAS_S_SET;
	node_type["si"] = BAS_V_PREDEF;
	node_type["single"] = BAS_S_SINGLE;
	node_type["size"] = BAS_S_SIZE;
	node_type["sleep"] = BAS_S_SLEEP;
	node_type["so"] = BAS_V_PREDEF;
	node_type["sp"] = BAS_V_PREDEF;
	node_type["span"] = BAS_S_SPAN;
	node_type["step"] = BAS_S_STEP;
	node_type["stop"] = BAS_S_STOP;
	node_type["stream"] = BAS_S_STREAM;
	node_type["string"] = BAS_S_STRING;
	node_type["sub"] = BAS_S_SUB;
	node_type["subend"] = BAS_S_SUBEND;
	node_type["subexit"] = BAS_S_SUBEXIT;
	node_type["temporary"] = BAS_S_TEMPORARY;
	node_type["then"] = BAS_S_THEN;
	node_type["to"] = BAS_S_TO;
	node_type["trn"] = BAS_S_TRN;
	node_type["type"] = BAS_S_TYPE;
	node_type["undefined"] = BAS_S_UNDEFINED;
	node_type["unless"] = BAS_S_UNLESS;
	node_type["unlock"] = BAS_S_UNLOCK;
	node_type["until"] = BAS_S_UNTIL;
	node_type["update"] = BAS_S_UPDATE;
	node_type["use"] = BAS_S_USE;
	node_type["using"] = BAS_S_USING;
	node_type["value"] = BAS_S_VALUE;
	node_type["variable"] = BAS_S_VARIABLE;
	node_type["variant"] = BAS_S_VARIANT;
	node_type["virtual"] = BAS_S_VIRTUAL;
	node_type["vt"] = BAS_V_PREDEF;
	node_type["wait"] = BAS_S_WAIT;
	node_type["when"] = BAS_S_WHEN;
	node_type["while"] = BAS_S_WHILE;
	node_type["windowsize"] = BAS_S_WINDOWSIZE;
	node_type["word"] = BAS_S_WORD;
	node_type["write"] = BAS_S_WRITE;
	node_type["xor"] = BAS_S_XOR;
	node_type["zer"] = BAS_S_ZER;
}